

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O2

void __thiscall
SimpleDescriptor<Point3f>::compute
          (SimpleDescriptor<Point3f> *this,Point3f *query,
          vector<Point3f,_std::allocator<Point3f>_> *pts,
          Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *oct,
          vector<float,_std::allocator<float>_> *descriptor)

{
  uint uVar1;
  pointer pfVar2;
  uint32_t i;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> neighbors;
  vector<float,_std::allocator<float>_> distances;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  memset((descriptor->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_start,0,(ulong)this->dim_);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unibn::Octree<Point3f,std::vector<Point3f,std::allocator<Point3f>>>::
  radiusNeighbors<unibn::MaxDistance<Point3f>>
            ((Octree<Point3f,std::vector<Point3f,std::allocator<Point3f>>> *)oct,query,this->radius_
             ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
             (vector<float,_std::allocator<float>_> *)&local_48);
  uVar1 = this->dim_;
  pfVar2 = (descriptor->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    fVar5 = (local_48._M_impl.super__Vector_impl_data._M_start[uVar3] / this->radius_) *
            (float)uVar1;
    uVar4 = (ulong)fVar5;
    uVar4 = (long)(fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
    pfVar2[uVar4] = pfVar2[uVar4] + 1.0;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void compute(const PointT& query, const std::vector<PointT>& pts, const unibn::Octree<PointT>& oct,
               std::vector<float>& descriptor)
  {
    memset(&descriptor[0], 0, dim_);

    std::vector<uint32_t> neighbors;
    std::vector<float> distances;

    // template is needed to tell the compiler that radiusNeighbors is a method.
    oct.template radiusNeighbors<unibn::MaxDistance<PointT> >(query, radius_, neighbors, distances);
    for (uint32_t i = 0; i < neighbors.size(); ++i) descriptor[distances[i] / radius_ * dim_] += 1;
  }